

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

pointer __thiscall
slang::SmallVectorBase<slang::logic_t>::emplaceRealloc<slang::logic_t>
          (SmallVectorBase<slang::logic_t> *this,pointer pos,logic_t *args)

{
  ulong uVar1;
  pointer p;
  pointer plVar2;
  pointer plVar3;
  pointer plVar4;
  size_type sVar5;
  long lVar6;
  ulong n;
  
  if (this->len == 0x7fffffffffffffff) {
    detail::throwLengthError();
  }
  n = this->len + 1;
  uVar1 = this->cap;
  if (n < uVar1 * 2) {
    n = uVar1 * 2;
  }
  if (0x7fffffffffffffff - uVar1 < uVar1) {
    n = 0x7fffffffffffffff;
  }
  lVar6 = (long)pos - (long)this->data_;
  plVar2 = (pointer)operator_new(n);
  plVar2[lVar6].value = args->value;
  p = this->data_;
  sVar5 = this->len;
  plVar3 = p;
  plVar4 = plVar2;
  if (p + (sVar5 - (long)pos) == (pointer)0x0) {
    plVar3 = plVar2;
    plVar4 = p;
    if (sVar5 != 0) {
      do {
        plVar3->value = plVar4->value;
        plVar4 = plVar4 + 1;
        plVar3 = plVar3 + 1;
      } while (plVar4 != pos);
    }
  }
  else {
    for (; plVar3 != pos; plVar3 = plVar3 + 1) {
      plVar4->value = plVar3->value;
      plVar4 = plVar4 + 1;
    }
    memcpy(plVar2 + lVar6 + 1,pos,(size_t)(p + (sVar5 - (long)pos)));
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
    sVar5 = this->len;
  }
  this->len = sVar5 + 1;
  this->cap = n;
  this->data_ = plVar2;
  return plVar2 + lVar6;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}